

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall
JsonNumber_Uint64Max_Test::~JsonNumber_Uint64Max_Test(JsonNumber_Uint64Max_Test *this)

{
  anon_unknown.dwarf_105ba8::JsonNumber::~JsonNumber(&this->super_JsonNumber);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonNumber, Uint64Max) {
    PSTORE_ASSERT (uint64_max_str == std::to_string (uint64_max) &&
                   "The hard-wired unsigned 64-bit max string seems to be incorrect");
    EXPECT_CALL (callbacks_, uint64_value (uint64_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_max_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}